

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
::
basic_json_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
          (basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
           *this,iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *source,basic_json_visitor<char> *visitor,basic_json_decode_options<char> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  char *in_RDX;
  json_source_adaptor<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_R8;
  allocator<char> *in_stack_000000b8;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_stack_000000c0;
  basic_json_decode_options<char> *in_stack_000000c8;
  basic_json_parser<char,_std::allocator<char>_> *in_stack_000000d0;
  iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  
  json_source_adaptor<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
  ::
  json_source_adaptor<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            (in_RDI,in_stack_ffffffffffffff78);
  basic_default_json_visitor<char>::basic_default_json_visitor
            ((basic_default_json_visitor<char> *)in_RDI);
  in_RDI[1].source_.end_._M_current = in_RDX;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
             &in_RDI[1].source_.position_,in_R8);
  basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)0x9d3fcd);
  return;
}

Assistant:

basic_json_reader(Sourceable&& source,
                          basic_json_visitor<CharT>& visitor, 
                          const basic_json_decode_options<CharT>& options,
                          std::function<bool(json_errc,const ser_context&)> err_handler, 
                          const TempAllocator& temp_alloc = TempAllocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options,err_handler,temp_alloc)
        {
        }